

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicProfileInfo.cpp
# Opt level: O2

bool __thiscall
Js::DynamicProfileInfo::Serialize<Js::BufferWriter>(DynamicProfileInfo *this,BufferWriter *writer)

{
  Type TVar1;
  BVFixed *this_00;
  bool bVar2;
  ProfileId PVar3;
  uint uVar4;
  BVIndex BVar5;
  FunctionBody *this_01;
  WriteBarrierPtr<ValueType> local_b8;
  WriteBarrierPtr<Js::LdLenInfo> local_b0;
  WriteBarrierPtr<Js::LdElemInfo> local_a8;
  WriteBarrierPtr<Js::StElemInfo> local_a0;
  WriteBarrierPtr<Js::ArrayCallSiteInfo> local_98;
  WriteBarrierPtr<Js::FldInfo> local_90;
  WriteBarrierPtr<ValueType> local_88;
  WriteBarrierPtr<Js::CallSiteInfo> local_80;
  WriteBarrierPtr<Js::CallSiteInfo> local_78;
  WriteBarrierPtr<ValueType> local_70;
  WriteBarrierPtr<ValueType> local_68;
  WriteBarrierPtr<ValueType> local_60;
  WriteBarrierPtr<Js::ImplicitCallFlags> local_58;
  LocalFunctionId local_4c;
  uint local_48;
  uint local_44;
  Type local_3e;
  Type local_3c;
  Type local_3a;
  Type local_38;
  Type local_36;
  Type local_34;
  ProfileId local_32;
  Type local_30;
  Type local_2e;
  Type local_2c;
  ushort local_2a [4];
  ArgSlot paramInfoCount;
  
  BufferWriter::Log((BufferWriter *)this,this);
  this_01 = GetFunctionBody(this);
  TVar1 = (this_01->super_ParseableFunctionInfo).m_inParamCount;
  local_2a[0] = TVar1 - 1;
  if (TVar1 == 0) {
    local_2a[0] = 0;
  }
  local_4c = FunctionProxy::GetLocalFunctionId((FunctionProxy *)this_01);
  bVar2 = BufferWriter::Write<unsigned_int>(writer,&local_4c);
  if ((bVar2) && (bVar2 = BufferWriter::Write<unsigned_short>(writer,local_2a), bVar2)) {
    Memory::WriteBarrierPtr<ValueType>::WriteBarrierPtr(&local_b8,&this->parameterInfo);
    bVar2 = BufferWriter::WriteArray<ValueType>(writer,local_b8.ptr,(ulong)local_2a[0]);
    if (bVar2) {
      local_3e = this_01->profiledLdLenCount;
      bVar2 = BufferWriter::Write<unsigned_short>(writer,&local_3e);
      if (bVar2) {
        Memory::WriteBarrierPtr<Js::LdLenInfo>::WriteBarrierPtr(&local_b0,&this->ldLenInfo);
        bVar2 = BufferWriter::WriteArray<Js::LdLenInfo>
                          (writer,local_b0.ptr,(ulong)this_01->profiledLdLenCount);
        if (bVar2) {
          local_3c = this_01->profiledLdElemCount;
          bVar2 = BufferWriter::Write<unsigned_short>(writer,&local_3c);
          if (bVar2) {
            Memory::WriteBarrierPtr<Js::LdElemInfo>::WriteBarrierPtr(&local_a8,&this->ldElemInfo);
            bVar2 = BufferWriter::WriteArray<Js::LdElemInfo>
                              (writer,local_a8.ptr,(ulong)this_01->profiledLdElemCount);
            if (bVar2) {
              local_3a = this_01->profiledStElemCount;
              bVar2 = BufferWriter::Write<unsigned_short>(writer,&local_3a);
              if (bVar2) {
                Memory::WriteBarrierPtr<Js::StElemInfo>::WriteBarrierPtr
                          (&local_a0,&this->stElemInfo);
                bVar2 = BufferWriter::WriteArray<Js::StElemInfo>
                                  (writer,local_a0.ptr,(ulong)this_01->profiledStElemCount);
                if (bVar2) {
                  local_38 = this_01->profiledArrayCallSiteCount;
                  bVar2 = BufferWriter::Write<unsigned_short>(writer,&local_38);
                  if (bVar2) {
                    Memory::WriteBarrierPtr<Js::ArrayCallSiteInfo>::WriteBarrierPtr
                              (&local_98,&this->arrayCallSiteInfo);
                    bVar2 = BufferWriter::WriteArray<Js::ArrayCallSiteInfo>
                                      (writer,local_98.ptr,
                                       (ulong)this_01->profiledArrayCallSiteCount);
                    if (bVar2) {
                      local_48 = FunctionBody::GetInlineCacheCount(this_01);
                      bVar2 = BufferWriter::Write<unsigned_int>(writer,&local_48);
                      if (bVar2) {
                        Memory::WriteBarrierPtr<Js::FldInfo>::WriteBarrierPtr
                                  (&local_90,&this->fldInfo);
                        uVar4 = FunctionBody::GetInlineCacheCount(this_01);
                        bVar2 = BufferWriter::WriteArray<Js::FldInfo>
                                          (writer,local_90.ptr,(ulong)uVar4);
                        if (bVar2) {
                          local_36 = this_01->profiledSlotCount;
                          bVar2 = BufferWriter::Write<unsigned_short>(writer,&local_36);
                          if (bVar2) {
                            Memory::WriteBarrierPtr<ValueType>::WriteBarrierPtr
                                      (&local_88,&this->slotInfo);
                            bVar2 = BufferWriter::WriteArray<ValueType>
                                              (writer,local_88.ptr,(ulong)this_01->profiledSlotCount
                                              );
                            if (bVar2) {
                              local_34 = this_01->profiledCallSiteCount;
                              bVar2 = BufferWriter::Write<unsigned_short>(writer,&local_34);
                              if (bVar2) {
                                Memory::WriteBarrierPtr<Js::CallSiteInfo>::WriteBarrierPtr
                                          (&local_80,&this->callSiteInfo);
                                bVar2 = BufferWriter::WriteArray<Js::CallSiteInfo>
                                                  (writer,local_80.ptr,
                                                   (ulong)this_01->profiledCallSiteCount);
                                if (bVar2) {
                                  local_32 = FunctionBody::GetProfiledCallApplyCallSiteCount
                                                       (this_01);
                                  bVar2 = BufferWriter::Write<unsigned_short>(writer,&local_32);
                                  if (bVar2) {
                                    Memory::WriteBarrierPtr<Js::CallSiteInfo>::WriteBarrierPtr
                                              (&local_78,&this->callApplyTargetInfo);
                                    PVar3 = FunctionBody::GetProfiledCallApplyCallSiteCount(this_01)
                                    ;
                                    bVar2 = BufferWriter::WriteArray<Js::CallSiteInfo>
                                                      (writer,local_78.ptr,(ulong)PVar3);
                                    if (bVar2) {
                                      local_30 = this_01->profiledDivOrRemCount;
                                      bVar2 = BufferWriter::Write<unsigned_short>(writer,&local_30);
                                      if (bVar2) {
                                        Memory::WriteBarrierPtr<ValueType>::WriteBarrierPtr
                                                  (&local_70,&this->divideTypeInfo);
                                        bVar2 = BufferWriter::WriteArray<ValueType>
                                                          (writer,local_70.ptr,
                                                           (ulong)this_01->profiledDivOrRemCount);
                                        if (bVar2) {
                                          local_2e = this_01->profiledSwitchCount;
                                          bVar2 = BufferWriter::Write<unsigned_short>
                                                            (writer,&local_2e);
                                          if (bVar2) {
                                            Memory::WriteBarrierPtr<ValueType>::WriteBarrierPtr
                                                      (&local_68,&this->switchTypeInfo);
                                            bVar2 = BufferWriter::WriteArray<ValueType>
                                                              (writer,local_68.ptr,
                                                               (ulong)this_01->profiledSwitchCount);
                                            if (bVar2) {
                                              local_2c = this_01->profiledReturnTypeCount;
                                              bVar2 = BufferWriter::Write<unsigned_short>
                                                                (writer,&local_2c);
                                              if (bVar2) {
                                                Memory::WriteBarrierPtr<ValueType>::WriteBarrierPtr
                                                          (&local_60,&this->returnTypeInfo);
                                                bVar2 = BufferWriter::WriteArray<ValueType>
                                                                  (writer,local_60.ptr,
                                                                   (ulong)this_01->
                                                  profiledReturnTypeCount);
                                                if (bVar2) {
                                                  local_44 = FunctionBody::GetLoopCount(this_01);
                                                  bVar2 = BufferWriter::Write<unsigned_int>
                                                                    (writer,&local_44);
                                                  if (bVar2) {
                                                    Memory::WriteBarrierPtr<Js::ImplicitCallFlags>::
                                                    WriteBarrierPtr(&local_58,
                                                                    &this->loopImplicitCallFlags);
                                                    uVar4 = FunctionBody::GetLoopCount(this_01);
                                                    bVar2 = BufferWriter::
                                                            WriteArray<Js::ImplicitCallFlags>
                                                                      (writer,local_58.ptr,
                                                                       (ulong)uVar4);
                                                    if ((((bVar2) &&
                                                         (bVar2 = BufferWriter::
                                                                  Write<Js::ImplicitCallFlags>
                                                                            (writer,&this->
                                                  implicitCallFlags), bVar2)) &&
                                                  (bVar2 = BufferWriter::Write<Js::ThisInfo>
                                                                     (writer,&this->thisInfo), bVar2
                                                  )) && ((bVar2 = BufferWriter::
                                                                                                                                    
                                                  Write<Js::DynamicProfileInfo::Bits>
                                                            (writer,&this->bits), bVar2 &&
                                                  (bVar2 = BufferWriter::Write<unsigned_int>
                                                                     (writer,&this->
                                                  m_recursiveInlineInfo), bVar2)))) {
                                                    this_00 = (this->loopFlags).ptr;
                                                    if (this_00 == (BVFixed *)0x0) {
                                                      return true;
                                                    }
                                                    BVar5 = BVFixed::WordCount(this_00);
                                                    bVar2 = BufferWriter::
                                                            WriteArray<BVUnitT<unsigned_long>>
                                                                      (writer,(
                                                  BVUnitT<unsigned_long> *)(this_00 + 1),
                                                  (ulong)BVar5);
                                                  return bVar2;
                                                  }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return false;
}

Assistant:

bool DynamicProfileInfo::Serialize(T * writer)
    {
#if DBG_DUMP
        writer->Log(this);
#endif
        FunctionBody * functionBody = this->GetFunctionBody();
        Js::ArgSlot paramInfoCount = functionBody->GetProfiledInParamsCount();
        if (!writer->Write(functionBody->GetLocalFunctionId())
            || !writer->Write(paramInfoCount)
            || !writer->WriteArray(this->parameterInfo, paramInfoCount)
            || !writer->Write(functionBody->GetProfiledLdLenCount())
            || !writer->WriteArray(this->ldLenInfo, functionBody->GetProfiledLdLenCount())
            || !writer->Write(functionBody->GetProfiledLdElemCount())
            || !writer->WriteArray(this->ldElemInfo, functionBody->GetProfiledLdElemCount())
            || !writer->Write(functionBody->GetProfiledStElemCount())
            || !writer->WriteArray(this->stElemInfo, functionBody->GetProfiledStElemCount())
            || !writer->Write(functionBody->GetProfiledArrayCallSiteCount())
            || !writer->WriteArray(this->arrayCallSiteInfo, functionBody->GetProfiledArrayCallSiteCount())
            || !writer->Write(functionBody->GetProfiledFldCount())
            || !writer->WriteArray(this->fldInfo, functionBody->GetProfiledFldCount())
            || !writer->Write(functionBody->GetProfiledSlotCount())
            || !writer->WriteArray(this->slotInfo, functionBody->GetProfiledSlotCount())
            || !writer->Write(functionBody->GetProfiledCallSiteCount())
            || !writer->WriteArray(this->callSiteInfo, functionBody->GetProfiledCallSiteCount())
            || !writer->Write(functionBody->GetProfiledCallApplyCallSiteCount())
            || !writer->WriteArray(this->callApplyTargetInfo, functionBody->GetProfiledCallApplyCallSiteCount())
            || !writer->Write(functionBody->GetProfiledDivOrRemCount())
            || !writer->WriteArray(this->divideTypeInfo, functionBody->GetProfiledDivOrRemCount())
            || !writer->Write(functionBody->GetProfiledSwitchCount())
            || !writer->WriteArray(this->switchTypeInfo, functionBody->GetProfiledSwitchCount())
            || !writer->Write(functionBody->GetProfiledReturnTypeCount())
            || !writer->WriteArray(this->returnTypeInfo, functionBody->GetProfiledReturnTypeCount())
            || !writer->Write(functionBody->GetLoopCount())
            || !writer->WriteArray(this->loopImplicitCallFlags, functionBody->GetLoopCount())
            || !writer->Write(this->implicitCallFlags)
            || !writer->Write(this->thisInfo)
            || !writer->Write(this->bits)
            || !writer->Write(this->m_recursiveInlineInfo)
            || (this->loopFlags && !writer->WriteArray(this->loopFlags->GetData(), this->loopFlags->WordCount())))
        {
            return false;
        }
        return true;
    }